

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteBlif.c
# Opt level: O2

void Prs_ManWriteBlif(char *pFileName,Vec_Ptr_t *vPrs)

{
  Vec_Int_t *p;
  uint __line;
  int iVar1;
  int iVar2;
  int iVar3;
  Prs_Ntk_t *pPVar4;
  FILE *__stream;
  char *pcVar5;
  char *pcVar6;
  int i;
  int i_00;
  Vec_Int_t *p_00;
  
  if (vPrs->nSize < 1) {
    pPVar4 = (Prs_Ntk_t *)0x0;
  }
  else {
    pPVar4 = (Prs_Ntk_t *)Vec_PtrEntry(vPrs,0);
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  pcVar5 = Prs_NtkStr(pPVar4,pPVar4->iModuleName);
  pcVar6 = Extra_TimeStamp();
  fprintf(__stream,"# Design \"%s\" written by ABC on %s\n\n",pcVar5,pcVar6);
  i_00 = 0;
  do {
    if (vPrs->nSize <= i_00) {
      fclose(__stream);
      return;
    }
    pPVar4 = (Prs_Ntk_t *)Vec_PtrEntry(vPrs,i_00);
    pcVar5 = Prs_NtkStr(pPVar4,pPVar4->iModuleName);
    fprintf(__stream,".model %s\n",pcVar5);
    if (((pPVar4->vInouts).nSize != 0) &&
       (fwrite(".inouts",7,1,__stream), (pPVar4->vInouts).nSize != 0)) {
      Prs_ManWriteBlifArray((FILE *)__stream,pPVar4,&pPVar4->vInouts);
    }
    fwrite(".inputs",7,1,__stream);
    Prs_ManWriteBlifArray((FILE *)__stream,pPVar4,&pPVar4->vInputs);
    fwrite(".outputs",8,1,__stream);
    Prs_ManWriteBlifArray((FILE *)__stream,pPVar4,&pPVar4->vOutputs);
    p = &pPVar4->vObjs;
    p_00 = &pPVar4->vBoxes;
    for (i = 0; i < (pPVar4->vObjs).nSize; i = i + 1) {
      Prs_BoxSignals_V._0_4_ = Prs_BoxSize(pPVar4,i);
      Prs_BoxSignals_V._4_4_ = Prs_BoxSignals_V._0_4_;
      iVar1 = Vec_IntEntry(p,i);
      if ((iVar1 < -3) || ((pPVar4->vBoxes).nSize <= (int)(iVar1 + 3U))) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      Prs_BoxSignals_V._8_8_ = (pPVar4->vBoxes).pArray + (iVar1 + 3U);
      iVar1 = Vec_IntEntry(p,i);
      iVar1 = Vec_IntEntry(p_00,iVar1 + 1);
      iVar2 = Prs_BoxSize(pPVar4,i);
      if (iVar2 < 2) {
        pcVar5 = "Prs_BoxIONum(p, i) > 0";
        __line = 0x3d;
LAB_0035ba2a:
        __assert_fail(pcVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaWriteBlif.c"
                      ,__line,"void Prs_ManWriteBlifLines(FILE *, Prs_Ntk_t *)");
      }
      if ((Prs_BoxSignals_V._4_4_ & 1) != 0) {
        pcVar5 = "Vec_IntSize(vBox) % 2 == 0";
        __line = 0x3e;
        goto LAB_0035ba2a;
      }
      if (iVar1 == -1) {
        fwrite(".latch",6,1,__stream);
        iVar1 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,1);
        pcVar5 = Prs_NtkStr(pPVar4,iVar1);
        fprintf(__stream," %s",pcVar5);
        iVar1 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,3);
        pcVar5 = Prs_NtkStr(pPVar4,iVar1);
        fprintf(__stream," %s",pcVar5);
        iVar1 = Vec_IntEntry(p,i);
        iVar1 = Vec_IntEntry(p_00,iVar1 + 2);
        fprintf(__stream," %c\n",(ulong)(iVar1 + 0x30));
      }
      else {
        iVar2 = Vec_IntEntry(p,i);
        iVar2 = Vec_IntEntry(p_00,iVar2 + 3);
        if (iVar2 == 0) {
          fwrite(".names",6,1,__stream);
          for (iVar2 = 0; iVar2 + 1 < (int)Prs_BoxSignals_V._4_4_; iVar2 = iVar2 + 2) {
            Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,iVar2);
            iVar3 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,iVar2 + 1);
            pcVar5 = Prs_NtkStr(pPVar4,iVar3);
            fprintf(__stream," %s",pcVar5);
          }
          pcVar5 = Abc_NamStr(pPVar4->pFuns,iVar1);
          fprintf(__stream,"\n%s",pcVar5);
        }
        else {
          fwrite(".subckt",7,1,__stream);
          pcVar5 = Prs_NtkStr(pPVar4,iVar1);
          fprintf(__stream," %s",pcVar5);
          for (iVar1 = 0; iVar1 + 1 < (int)Prs_BoxSignals_V._4_4_; iVar1 = iVar1 + 2) {
            iVar2 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,iVar1);
            iVar3 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,iVar1 + 1);
            pcVar5 = Prs_NtkStr(pPVar4,iVar2);
            pcVar6 = Prs_NtkStr(pPVar4,iVar3);
            fprintf(__stream," %s=%s",pcVar5,pcVar6);
          }
          fputc(10,__stream);
        }
      }
    }
    fwrite(".end\n\n",6,1,__stream);
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void Prs_ManWriteBlif( char * pFileName, Vec_Ptr_t * vPrs )
{
    Prs_Ntk_t * pNtk = Prs_ManRoot(vPrs);
    FILE * pFile = fopen( pFileName, "wb" ); int i;
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# Design \"%s\" written by ABC on %s\n\n", Prs_NtkStr(pNtk, pNtk->iModuleName), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Prs_Ntk_t *, vPrs, pNtk, i )
        Prs_ManWriteBlifNtk( pFile, pNtk );
    fclose( pFile );
}